

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.cc
# Opt level: O1

X509 * X509_find_by_issuer_and_serial(stack_st_X509 *sk,X509_NAME *name,ASN1_INTEGER *serial)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  X509 *pXVar4;
  size_t sVar5;
  X509 *unaff_R12;
  
  if (((serial->type | 0x100U) == 0x102) &&
     (sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)sk), sVar3 != 0)) {
    sVar3 = 0;
    do {
      pXVar4 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)sk,sVar3);
      iVar2 = ASN1_INTEGER_cmp(pXVar4->cert_info->serialNumber,serial);
      if ((iVar2 == 0) && (iVar2 = X509_NAME_cmp(pXVar4->cert_info->issuer,name), iVar2 == 0)) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
        pXVar4 = unaff_R12;
      }
      if (!bVar1) {
        return pXVar4;
      }
      sVar3 = sVar3 + 1;
      sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)sk);
      unaff_R12 = pXVar4;
    } while (sVar3 < sVar5);
  }
  return (X509 *)0x0;
}

Assistant:

X509 *X509_find_by_issuer_and_serial(const STACK_OF(X509) *sk, X509_NAME *name,
                                     const ASN1_INTEGER *serial) {
  if (serial->type != V_ASN1_INTEGER && serial->type != V_ASN1_NEG_INTEGER) {
    return NULL;
  }

  for (size_t i = 0; i < sk_X509_num(sk); i++) {
    X509 *x509 = sk_X509_value(sk, i);
    if (ASN1_INTEGER_cmp(X509_get0_serialNumber(x509), serial) == 0 &&
        X509_NAME_cmp(X509_get_issuer_name(x509), name) == 0) {
      return x509;
    }
  }
  return NULL;
}